

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)

{
  uint uVar1;
  uint in_EDI;
  ImGuiContext *g;
  bool local_16;
  bool local_15;
  bool local_1;
  
  if ((in_EDI & 4) == 0) {
    uVar1 = in_EDI & 3;
    if (uVar1 == 1) {
      local_16 = false;
      if (GImGui->NavWindow != (ImGuiWindow *)0x0) {
        local_16 = IsWindowChildOf(GImGui->NavWindow,GImGui->CurrentWindow);
      }
      local_1 = local_16;
    }
    else if (uVar1 == 2) {
      local_1 = GImGui->NavWindow == GImGui->CurrentWindow->RootWindow;
    }
    else if (uVar1 == 3) {
      local_15 = false;
      if (GImGui->NavWindow != (ImGuiWindow *)0x0) {
        local_15 = GImGui->NavWindow->RootWindow == GImGui->CurrentWindow->RootWindow;
      }
      local_1 = local_15;
    }
    else {
      local_1 = GImGui->NavWindow == GImGui->CurrentWindow;
    }
  }
  else {
    local_1 = GImGui->NavWindow != (ImGuiWindow *)0x0;
  }
  return local_1;
}

Assistant:

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)
{
    ImGuiContext& g = *GImGui;

    if (flags & ImGuiFocusedFlags_AnyWindow)
        return g.NavWindow != NULL;

    IM_ASSERT(g.CurrentWindow);     // Not inside a Begin()/End()
    switch (flags & (ImGuiFocusedFlags_RootWindow | ImGuiFocusedFlags_ChildWindows))
    {
    case ImGuiFocusedFlags_RootWindow | ImGuiFocusedFlags_ChildWindows:
        return g.NavWindow && g.NavWindow->RootWindow == g.CurrentWindow->RootWindow;
    case ImGuiFocusedFlags_RootWindow:
        return g.NavWindow == g.CurrentWindow->RootWindow;
    case ImGuiFocusedFlags_ChildWindows:
        return g.NavWindow && IsWindowChildOf(g.NavWindow, g.CurrentWindow);
    default:
        return g.NavWindow == g.CurrentWindow;
    }
}